

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/generator.cc:365:55)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_cpp_generator_cc:365:55)>_>
          *this,Descriptor *descriptor)

{
  long lVar1;
  long lVar2;
  
  if (0 < descriptor->field_count_) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      Visit<>(this,(FieldDescriptor *)(&descriptor->fields_->super_SymbolBase + lVar2));
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x58;
    } while (lVar1 < descriptor->field_count_);
  }
  if (0 < descriptor->nested_type_count_) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      Visit<>(this,(Descriptor *)(&descriptor->nested_types_->super_SymbolBase + lVar2));
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0xa0;
    } while (lVar1 < descriptor->nested_type_count_);
  }
  if (0 < descriptor->extension_count_) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      Visit<>(this,(FieldDescriptor *)(&descriptor->extensions_->super_SymbolBase + lVar2));
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x58;
    } while (lVar1 < descriptor->extension_count_);
  }
  return;
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }